

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall amrex::AmrLevel::CreateLevelDirectory(AmrLevel *this,string *dir)

{
  bool bVar1;
  string FullPath;
  string LevelDir;
  string local_48;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  LevelDirectoryNames(this,dir,&local_28,&local_48);
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    bVar1 = UtilCreateDirectory(&local_48,0x1ed,false);
    if (!bVar1) {
      CreateDirectoryFailed(&local_48);
    }
  }
  this->levelDirectoryCreated = true;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void
AmrLevel::CreateLevelDirectory (const std::string &dir)
{
    // Build directory to hold the MultiFabs in the StateData at this level.
    // The directory is relative the the directory containing the Header file.

    std::string LevelDir, FullPath;
    LevelDirectoryNames(dir, LevelDir, FullPath);

    if(ParallelDescriptor::IOProcessor()) {
      if( ! amrex::UtilCreateDirectory(FullPath, 0755)) {
        amrex::CreateDirectoryFailed(FullPath);
      }
    }
    levelDirectoryCreated = true;
}